

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O0

Value __thiscall
jbcoin::STParsedJSONDetail::bad_type(STParsedJSONDetail *this,string *object,string *field)

{
  undefined8 extraout_RDX;
  Value VVar1;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *field_local;
  string *object_local;
  
  local_20 = field;
  field_local = object;
  object_local = (string *)this;
  make_name(&local_80,object,field);
  std::operator+(&local_60,"Field \'",&local_80);
  std::operator+(&local_40,&local_60,"\' has bad type.");
  RPC::make_error((RPC *)this,rpcINVALID_PARAMS,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  VVar1._8_8_ = extraout_RDX;
  VVar1.value_.map_ = (ObjectValues *)this;
  return VVar1;
}

Assistant:

static Json::Value bad_type (std::string const& object,
    std::string const& field)
{
    return RPC::make_error (rpcINVALID_PARAMS,
        "Field '" + make_name (object, field) + "' has bad type.");
}